

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

int ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                 void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                 float scale_max,ImVec2 frame_size)

{
  ImVec2 *p;
  ImGuiWindow *this;
  ImU32 IVar1;
  ImVec2 p_max;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 IVar4;
  ImU32 IVar5;
  uint uVar6;
  int iVar7;
  ImGuiContext *g;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImVec2 IVar12;
  ImVec2 pos;
  undefined4 in_XMM1_Db;
  float fVar13;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar14;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  uint local_f8;
  float local_e8;
  ImVec2 local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ImVec2 pos0;
  ImRect inner_bb;
  ImRect frame_bb;
  ImRect total_bb;
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return -1;
  }
  local_c8._4_4_ = in_XMM1_Db;
  local_c8._0_4_ = scale_max;
  local_c8._8_4_ = in_XMM1_Dc;
  local_c8._12_4_ = in_XMM1_Dd;
  uStack_b0 = in_XMM2_Dc;
  local_b8 = (undefined1  [8])frame_size;
  uStack_ac = in_XMM2_Dd;
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  IVar12 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar9 = (float)local_b8._0_4_;
  if (((float)local_b8._0_4_ == 0.0) && (!NAN((float)local_b8._0_4_))) {
    fVar9 = CalcItemWidth();
  }
  fVar18 = IVar12.x;
  if (((float)local_b8._4_4_ != 0.0) || (NAN((float)local_b8._4_4_))) {
    fVar11 = (pIVar2->Style).FramePadding.y;
  }
  else {
    fVar11 = (pIVar2->Style).FramePadding.y;
    local_b8._4_4_ = fVar11 + fVar11 + IVar12.y;
  }
  frame_bb.Min.x = (this->DC).CursorPos.x;
  frame_bb.Min.y = (this->DC).CursorPos.y;
  local_b8._0_4_ = fVar9;
  frame_bb.Max.x = fVar9 + frame_bb.Min.x;
  frame_bb.Max.y = (float)local_b8._4_4_ + frame_bb.Min.y;
  fVar9 = (pIVar2->Style).FramePadding.x;
  inner_bb.Min.x = fVar9 + frame_bb.Min.x;
  inner_bb.Min.y = frame_bb.Min.y + fVar11;
  inner_bb.Max.x = frame_bb.Max.x - fVar9;
  inner_bb.Max.y = frame_bb.Max.y - fVar11;
  fVar9 = 0.0;
  if (0.0 < fVar18) {
    fVar9 = (pIVar2->Style).ItemInnerSpacing.x + fVar18;
  }
  total_bb.Max.x = frame_bb.Max.x + fVar9;
  total_bb.Max.y = frame_bb.Max.y + 0.0;
  total_bb.Min.x = frame_bb.Min.x;
  total_bb.Min.y = frame_bb.Min.y;
  ItemSize(&total_bb,fVar11);
  bVar3 = ItemAdd(&total_bb,0,&frame_bb,0);
  if (!bVar3) {
    return -1;
  }
  bVar3 = ItemHoverable(&frame_bb,id);
  if ((scale_min != 3.4028235e+38) || (NAN(scale_min))) {
    local_e8 = scale_min;
    if (((float)local_c8._0_4_ != 3.4028235e+38) || (NAN((float)local_c8._0_4_))) goto LAB_0015acce;
  }
  iVar7 = 0;
  iVar8 = 0;
  if (0 < values_count) {
    iVar8 = values_count;
  }
  fVar9 = 3.4028235e+38;
  fVar11 = -3.4028235e+38;
  for (; iVar8 != iVar7; iVar7 = iVar7 + 1) {
    fVar10 = (*values_getter)(data,iVar7);
    if (!NAN(fVar10)) {
      if (fVar10 <= fVar9) {
        fVar9 = fVar10;
      }
      fVar11 = (float)((uint)fVar11 & -(uint)(fVar10 <= fVar11) |
                      ~-(uint)(fVar10 <= fVar11) & (uint)fVar10);
    }
  }
  local_e8 = (float)(~-(uint)(scale_min == 3.4028235e+38) & (uint)scale_min |
                    (uint)fVar9 & -(uint)(scale_min == 3.4028235e+38));
  local_c8._0_4_ =
       ~-(uint)((float)local_c8._0_4_ == 3.4028235e+38) & local_c8._0_4_ |
       (uint)fVar11 & -(uint)((float)local_c8._0_4_ == 3.4028235e+38);
LAB_0015acce:
  IVar12.y = frame_bb.Min.y;
  IVar12.x = frame_bb.Min.x;
  p_max.y = frame_bb.Max.y;
  p_max.x = frame_bb.Max.x;
  IVar4 = GetColorU32(7,1.0);
  RenderFrame(IVar12,p_max,IVar4,true,(pIVar2->Style).FrameRounding);
  if (values_count < (int)((plot_type == ImGuiPlotType_Lines) + 1)) {
    local_f8 = 0xffffffff;
  }
  else {
    iVar8 = (int)(float)local_b8._0_4_;
    if (values_count <= (int)(float)local_b8._0_4_) {
      iVar8 = values_count;
    }
    iVar8 = iVar8 - (uint)(plot_type == ImGuiPlotType_Lines);
    iVar7 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
    local_f8 = 0xffffffff;
    uVar6 = local_f8;
    local_f8 = 0xffffffff;
    if (bVar3) {
      p = &(pIVar2->IO).MousePos;
      bVar3 = ImRect::Contains(&inner_bb,p);
      uVar6 = local_f8;
      if (bVar3) {
        fVar11 = (p->x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x);
        fVar9 = 0.9999;
        if (fVar11 <= 0.9999) {
          fVar9 = fVar11;
        }
        uVar6 = (uint)((float)iVar7 * (float)(~-(uint)(fVar11 < 0.0) & (uint)fVar9));
        fVar9 = (*values_getter)(data,(int)(values_offset + uVar6) % values_count);
        (*values_getter)(data,(int)(values_offset + uVar6 + 1) % values_count);
        if (plot_type == ImGuiPlotType_Lines) {
          SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar6,(ulong)(uVar6 + 1));
        }
        else if (plot_type == ImGuiPlotType_Histogram) {
          SetTooltip("%d: %8.4g",(double)fVar9,(ulong)uVar6);
        }
      }
    }
    local_f8 = uVar6;
    _local_b8 = ZEXT416(~-(uint)(local_e8 == (float)local_c8._0_4_) &
                        (uint)(1.0 / ((float)local_c8._0_4_ - local_e8)));
    fVar9 = (*values_getter)(data,values_offset % values_count);
    fVar11 = (fVar9 - local_e8) * (float)local_b8._0_4_;
    fVar9 = 1.0;
    if (fVar11 <= 1.0) {
      fVar9 = fVar11;
    }
    if (0.0 <= (float)local_c8._0_4_ * local_e8) {
      fVar10 = (float)(~-(uint)(local_e8 < 0.0) & 0x3f800000);
    }
    else {
      fVar10 = local_e8 * (float)local_b8._0_4_ + 1.0;
    }
    local_c8 = ZEXT416((uint)(1.0 / (float)iVar8));
    IVar4 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26,1.0);
    IVar5 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x27,1.0);
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    fVar15 = 0.0;
    fVar9 = (float)(-(uint)(fVar11 < 0.0) & 0x3f800000 |
                   ~-(uint)(fVar11 < 0.0) & (uint)(1.0 - fVar9));
    while (bVar3 = iVar8 != 0, iVar8 = iVar8 + -1, bVar3) {
      uVar6 = (uint)(fVar15 * (float)iVar7 + 0.5);
      fVar11 = (*values_getter)(data,(int)(values_offset + 1 + uVar6) % values_count);
      fVar16 = (float)local_c8._0_4_ + fVar15;
      fVar17 = (fVar11 - local_e8) * (float)local_b8._0_4_;
      fVar11 = 1.0;
      if (fVar17 <= 1.0) {
        fVar11 = fVar17;
      }
      fVar11 = (float)(-(uint)(fVar17 < 0.0) & 0x3f800000 |
                      ~-(uint)(fVar17 < 0.0) & (uint)(1.0 - fVar11));
      fVar14 = inner_bb.Min.x;
      local_d0.y = inner_bb.Min.y;
      fVar17 = inner_bb.Max.x - fVar14;
      fVar13 = inner_bb.Max.y - local_d0.y;
      fVar19 = fVar15 * fVar17 + fVar14;
      pos0.y = fVar9 * fVar13 + local_d0.y;
      pos0.x = fVar19;
      local_d0.x = fVar17 * fVar16 + fVar14;
      fVar15 = fVar16;
      fVar9 = fVar11;
      if (plot_type == ImGuiPlotType_Lines) {
        local_d0.y = fVar13 * fVar11 + local_d0.y;
        IVar1 = IVar4;
        if (local_f8 == uVar6) {
          IVar1 = IVar5;
        }
        ImDrawList::AddLine(this->DrawList,&pos0,&local_d0,IVar1,1.0);
      }
      else {
        local_d0.y = fVar13 * fVar10 + local_d0.y;
        if (plot_type == ImGuiPlotType_Histogram) {
          if (fVar19 + 2.0 <= local_d0.x) {
            local_d0.x = local_d0.x + -1.0;
          }
          IVar1 = IVar4;
          if (local_f8 == uVar6) {
            IVar1 = IVar5;
          }
          ImDrawList::AddRectFilled(this->DrawList,&pos0,&local_d0,IVar1,0.0,0);
        }
      }
    }
  }
  if (overlay_text != (char *)0x0) {
    pos0.y = frame_bb.Min.y + (pIVar2->Style).FramePadding.y;
    pos0.x = frame_bb.Min.x;
    local_d0.x = 0.5;
    local_d0.y = 0.0;
    RenderTextClipped(&pos0,&frame_bb.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_d0,
                      (ImRect *)0x0);
  }
  if (0.0 < fVar18) {
    pos.x = frame_bb.Max.x + (pIVar2->Style).ItemInnerSpacing.x;
    pos.y = inner_bb.Min.y;
    RenderText(pos,label,(char *)0x0,true);
    return local_f8;
  }
  return local_f8;
}

Assistant:

int ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return -1;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return -1;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    int idx_hovered = -1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx + 1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            idx_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (1 + scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f, 0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    // Return hovered index or -1 if none are hovered.
    // This is currently not exposed in the public API because we need a larger redesign of the whole thing, but in the short-term we are making it available in PlotEx().
    return idx_hovered;
}